

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O3

void WebPRescalerImportRowShrink_C(WebPRescaler *wrk,uint8_t *src)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  rescaler_t *prVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  
  uVar5 = (ulong)wrk->num_channels;
  if (0 < (long)uVar5) {
    iVar6 = wrk->dst_width * wrk->num_channels;
    uVar10 = 0;
    do {
      if ((int)uVar10 < iVar6) {
        uVar1 = wrk->fx_scale;
        iVar2 = wrk->x_add;
        iVar3 = wrk->x_sub;
        prVar4 = wrk->frow;
        iVar8 = 0;
        uVar14 = 0;
        uVar9 = uVar10 & 0xffffffff;
        uVar12 = uVar10;
        do {
          uVar13 = (uint)uVar14;
          bVar15 = SCARRY4(iVar8,iVar2);
          iVar8 = iVar8 + iVar2;
          if (iVar8 == 0 || bVar15 != iVar8 < 0) {
            uVar11 = 0;
          }
          else {
            lVar7 = 0;
            do {
              iVar8 = iVar8 - iVar3;
              uVar11 = (uint)src[lVar7 + (int)uVar9];
              uVar13 = (int)uVar14 + (uint)src[lVar7 + (int)uVar9];
              uVar14 = (ulong)uVar13;
              lVar7 = lVar7 + uVar5;
            } while (0 < iVar8);
            uVar9 = (ulong)(uint)((int)uVar9 + (int)lVar7);
          }
          prVar4[uVar12] = uVar13 * iVar3 + uVar11 * iVar8;
          uVar12 = uVar12 + uVar5;
          uVar14 = (ulong)-(uVar11 * iVar8) * (ulong)uVar1 + 0x80000000 >> 0x20;
        } while ((int)uVar12 < iVar6);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar5);
  }
  return;
}

Assistant:

void WebPRescalerImportRowShrink_C(WebPRescaler* WEBP_RESTRICT const wrk,
                                   const uint8_t* WEBP_RESTRICT src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(!wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    uint32_t sum = 0;
    int accum = 0;
    while (x_out < x_out_max) {
      uint32_t base = 0;
      accum += wrk->x_add;
      while (accum > 0) {
        accum -= wrk->x_sub;
        assert(x_in < wrk->src_width * x_stride);
        base = src[x_in];
        sum += base;
        x_in += x_stride;
      }
      {        // Emit next horizontal pixel.
        const rescaler_t frac = base * (-accum);
        wrk->frow[x_out] = sum * wrk->x_sub - frac;
        // fresh fractional start for next pixel
        sum = (int)MULT_FIX(frac, wrk->fx_scale);
      }
      x_out += x_stride;
    }
    assert(accum == 0);
  }
}